

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

wchar_t prt_stat_short(wchar_t stat,wchar_t row,wchar_t col)

{
  char *pcVar1;
  size_t sVar2;
  char local_38 [8];
  char tmp [32];
  wchar_t col_local;
  wchar_t row_local;
  wchar_t stat_local;
  
  tmp._28_4_ = col;
  if (player->stat_cur[stat] < player->stat_max[stat]) {
    pcVar1 = format("%c:",(ulong)(uint)(int)*stat_names_reduced[stat]);
    put_str(pcVar1,row,tmp._28_4_);
    cnv_stat((player->state).stat_use[stat],local_38,0x20);
    strskip(local_38,' ','\0');
    c_put_str('\v',local_38,row,tmp._28_4_ + L'\x02');
  }
  else {
    pcVar1 = format("%c:",(ulong)(uint)(int)*stat_names[stat]);
    put_str(pcVar1,row,tmp._28_4_);
    cnv_stat((player->state).stat_use[stat],local_38,0x20);
    strskip(local_38,' ','\0');
    if (player->stat_max[stat] == 0x76) {
      c_put_str('\x0e',local_38,row,tmp._28_4_ + L'\x02');
    }
    else {
      c_put_str('\r',local_38,row,tmp._28_4_ + L'\x02');
    }
  }
  sVar2 = strlen(local_38);
  return (int)sVar2 + L'\x03';
}

Assistant:

static int prt_stat_short(int stat, int row, int col)
{
	char tmp[32];

	/* Injured or healthy stat */
	if (player->stat_cur[stat] < player->stat_max[stat]) {
		put_str(format("%c:", stat_names_reduced[stat][0]), row, col);		
		cnv_stat(player->state.stat_use[stat], tmp, sizeof(tmp));
		/* Trim whitespace */
		strskip(tmp,' ', 0);
		c_put_str(COLOUR_YELLOW, tmp, row, col + 2);
	} else {
		put_str(format("%c:", stat_names[stat][0]), row, col);
		cnv_stat(player->state.stat_use[stat], tmp, sizeof(tmp));
		/* Trim whitespace */
		strskip(tmp,' ', 0);
		if (player->stat_max[stat] == 18+100) {
			c_put_str(COLOUR_L_BLUE, tmp, row, col + 2);
		}
		else {
			c_put_str(COLOUR_L_GREEN, tmp, row, col + 2);	
		}		
	}

	return 3+strlen(tmp);
}